

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_npn_parse_clienthello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  SSL *ssl_00;
  uint16_t uVar1;
  int iVar2;
  size_t sVar3;
  pointer psVar4;
  SSL *ssl;
  CBS *contents_local;
  uint8_t *out_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = hs->ssl;
  uVar1 = ssl_protocol_version(ssl_00);
  if (uVar1 < 0x304) {
    if ((contents != (CBS *)0x0) && (sVar3 = CBS_len(contents), sVar3 != 0)) {
      return false;
    }
    if ((((contents != (CBS *)0x0) && ((*(ushort *)&ssl_00->s3->field_0xdc >> 4 & 1) == 0)) &&
        (psVar4 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&ssl_00->ctx),
        psVar4->next_protos_advertised_cb !=
        (_func_int_SSL_ptr_uint8_t_ptr_ptr_uint_ptr_void_ptr *)0x0)) &&
       (iVar2 = SSL_is_dtls(ssl_00), iVar2 == 0)) {
      *(uint *)&hs->field_0x6c8 = *(uint *)&hs->field_0x6c8 & 0xffff7fff | 0x8000;
      return true;
    }
  }
  return true;
}

Assistant:

static bool ext_npn_parse_clienthello(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                                      CBS *contents) {
  SSL *const ssl = hs->ssl;
  if (ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
    return true;
  }

  if (contents != NULL && CBS_len(contents) != 0) {
    return false;
  }

  if (contents == NULL ||                             //
      ssl->s3->initial_handshake_complete ||          //
      ssl->ctx->next_protos_advertised_cb == NULL ||  //
      SSL_is_dtls(ssl)) {
    return true;
  }

  hs->next_proto_neg_seen = true;
  return true;
}